

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

void jinit_phuff_encoder(j_compress_ptr cinfo)

{
  undefined8 *puVar1;
  long in_RDI;
  int i;
  phuff_entropy_ptr entropy;
  int local_14;
  
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,200);
  *(undefined8 **)(in_RDI + 0x1f0) = puVar1;
  *puVar1 = start_pass_phuff;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    puVar1[(long)local_14 + 0x11] = 0;
    puVar1[(long)local_14 + 0x15] = 0;
  }
  puVar1[0xf] = 0;
  return;
}

Assistant:

GLOBAL(void)
jinit_phuff_encoder(j_compress_ptr cinfo)
{
  phuff_entropy_ptr entropy;
  int i;

  entropy = (phuff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(phuff_entropy_encoder));
  cinfo->entropy = (struct jpeg_entropy_encoder *)entropy;
  entropy->pub.start_pass = start_pass_phuff;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    entropy->derived_tbls[i] = NULL;
    entropy->count_ptrs[i] = NULL;
  }
  entropy->bit_buffer = NULL;   /* needed only in AC refinement scan */
}